

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle
          (GED_BasicGroundCombatVehicle *this,KUINT16 ID,KINT16 XOffset,KINT16 YOffset,
          KINT16 ZOffset,EntityAppearance *EA,KINT8 Psi,KINT8 Theta,KINT8 Phi,KINT8 Speed,
          KINT8 TurretAzimuth,KINT8 GunElevation,KINT8 TurretSlewRate,KINT8 GunElevationRate)

{
  EntityAppearance *EA_local;
  KINT16 ZOffset_local;
  KINT16 YOffset_local;
  KINT16 XOffset_local;
  KUINT16 ID_local;
  GED_BasicGroundCombatVehicle *this_local;
  
  GED::GED(&this->super_GED);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatVehicle_00330c28;
  this->m_ui16EntityID = ID;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA,EA);
  this->m_i8Spd = Speed;
  this->m_i8TrrtAz = TurretAzimuth;
  this->m_i8GnElv = GunElevation;
  this->m_i8TrrtSlwRt = TurretSlewRate;
  this->m_i8GnElvRt = GunElevationRate;
  this->m_i16Offsets[0] = XOffset;
  this->m_i16Offsets[1] = YOffset;
  this->m_i16Offsets[2] = ZOffset;
  this->m_i8Ori[0] = Psi;
  this->m_i8Ori[1] = Theta;
  this->m_i8Ori[2] = Phi;
  return;
}

Assistant:

GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA,
        KINT8 Psi, KINT8 Theta, KINT8 Phi, KINT8 Speed, KINT8 TurretAzimuth, KINT8 GunElevation,
        KINT8 TurretSlewRate, KINT8 GunElevationRate ) :
    m_ui16EntityID( ID ),
    m_EA( EA ),
    m_i8Spd( Speed ),
    m_i8TrrtAz( TurretAzimuth ),
    m_i8GnElv( GunElevation ),
    m_i8TrrtSlwRt( TurretSlewRate ),
    m_i8GnElvRt( GunElevationRate )
{
    m_i16Offsets[0] = XOffset;
    m_i16Offsets[1] = YOffset;
    m_i16Offsets[2] = ZOffset;
    m_i8Ori[0] = Psi;
    m_i8Ori[1] = Theta;
    m_i8Ori[2] = Phi;
}